

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall tetgenmesh::removeedgebyflips(tetgenmesh *this,triface *flipedge,flipconstraints *fc)

{
  tetrahedron *pppdVar1;
  tetrahedron *pppdVar2;
  double *pdVar3;
  arraypool *this_00;
  long lVar4;
  uint nn;
  char *pcVar5;
  tetrahedron *pppdVar6;
  triface *abtets;
  int iVar7;
  triface *ptVar8;
  uint uVar9;
  long lVar10;
  int *piVar11;
  int iVar12;
  ulong uVar13;
  
  pppdVar2 = flipedge->tet;
  if (((this->checksubsegflag == 0) || (pppdVar2[8] == (tetrahedron)0x0)) ||
     (pdVar3 = pppdVar2[8][ver2edge[flipedge->ver]], pdVar3 == (double *)0x0)) {
    iVar12 = flipedge->ver;
    lVar10 = 0;
    uVar9 = 0;
    pppdVar6 = pppdVar2;
    iVar7 = iVar12;
    do {
      pppdVar1 = pppdVar6 + facepivot1[iVar7];
      pppdVar6 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
      iVar7 = facepivot2[iVar7][(uint)*pppdVar1 & 0xf];
      uVar9 = uVar9 - 1;
      lVar10 = lVar10 + -0x10;
    } while (pppdVar2 != pppdVar6);
    if (0xfffffffd < uVar9) {
      puts("Please report this bug to Hang.Si@wias-berlin.de. Include");
      puts("  the message above, your input data set, and the exact");
      puts("  command line you used to run this program, thank you.");
      exit(2);
    }
    iVar7 = this->b->flipstarsize;
    nn = 0;
    if ((int)~uVar9 < iVar7 || iVar7 < 1) {
      abtets = (triface *)operator_new__(-lVar10);
      ptVar8 = abtets;
      do {
        ptVar8->tet = (tetrahedron *)0x0;
        ptVar8->ver = 0;
        ptVar8 = ptVar8 + 1;
      } while ((triface *)((long)abtets - lVar10) != ptVar8);
      piVar11 = &abtets->ver;
      pppdVar6 = pppdVar2;
      do {
        ((triface *)(piVar11 + -2))->tet = pppdVar6;
        *piVar11 = iVar12;
        *(undefined2 *)((long)pppdVar6 + (long)this->elemmarkerindex * 4 + 2) = 1;
        pppdVar1 = pppdVar6 + facepivot1[iVar12];
        pppdVar6 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
        iVar12 = facepivot2[iVar12][(uint)*pppdVar1 & 0xf];
        piVar11 = piVar11 + 4;
      } while (pppdVar2 != pppdVar6);
      nn = flipnm(this,abtets,-uVar9,0,0,fc);
      if (2 < (int)nn) {
        lVar10 = 0;
        do {
          lVar4 = *(long *)((long)&abtets->tet + lVar10);
          *(uint *)(lVar4 + (long)this->elemmarkerindex * 4) =
               (uint)*(ushort *)(lVar4 + (long)this->elemmarkerindex * 4);
          lVar10 = lVar10 + 0x10;
        } while ((ulong)nn << 4 != lVar10);
        flipedge->tet = abtets->tet;
        flipedge->ver = abtets->ver;
      }
      iVar12 = fc->unflip;
      fc->unflip = 0;
      flipnm_post(this,abtets,-uVar9,nn,0,fc);
      fc->unflip = iVar12;
      operator_delete__(abtets);
    }
  }
  else {
    nn = 0;
    if (fc->collectencsegflag != 0) {
      uVar13 = (ulong)pdVar3 & 0xfffffffffffffff8;
      uVar9 = *(uint *)(uVar13 + 4 + (long)this->shmarkindex * 4);
      if ((uVar9 & 1) == 0) {
        *(uint *)(uVar13 + 4 + (long)this->shmarkindex * 4) = uVar9 | 1;
        this_00 = this->caveencseglist;
        pcVar5 = arraypool::getblock(this_00,(int)this_00->objects);
        nn = 0;
        lVar10 = (long)this_00->objectbytes *
                 ((long)this_00->objectsperblock - 1U & this_00->objects);
        this_00->objects = this_00->objects + 1;
        *(ulong *)(pcVar5 + lVar10) = uVar13;
        *(uint *)(pcVar5 + lVar10 + 8) = (uint)pdVar3 & 7;
      }
    }
  }
  return nn;
}

Assistant:

int tetgenmesh::removeedgebyflips(triface *flipedge, flipconstraints* fc)
{
  triface *abtets, spintet;
  int t1ver; 
  int n, nn, i;


  if (checksubsegflag) {
    // Do not flip a segment.
    if (issubseg(*flipedge)) {
      if (fc->collectencsegflag) {
        face checkseg, *paryseg;
        tsspivot1(*flipedge, checkseg);
        if (!sinfected(checkseg)) {
          // Queue this segment in list.
          sinfect(checkseg);                
          caveencseglist->newindex((void **) &paryseg);
          *paryseg = checkseg;
        }
      }
      return 0;
    }
  }

  // Count the number of tets at edge [a,b].
  n = 0;
  spintet = *flipedge;
  while (1) {
    n++;
    fnextself(spintet);
    if (spintet.tet == flipedge->tet) break;
  }
  if (n < 3) {
    // It is only possible when the mesh contains inverted tetrahedra.  
    terminatetetgen(this, 2); // Report a bug
  }

  if ((b->flipstarsize > 0) && (n > b->flipstarsize)) {
    // The star size exceeds the limit.
    return 0; // Do not flip it.
  }

  // Allocate spaces.
  abtets = new triface[n];
  // Collect the tets at edge [a,b].
  spintet = *flipedge;
  i = 0;
  while (1) {
    abtets[i] = spintet;
    setelemcounter(abtets[i], 1); 
    i++;
    fnextself(spintet);
    if (spintet.tet == flipedge->tet) break;
  }


  // Try to flip the edge (level = 0, edgepivot = 0).
  nn = flipnm(abtets, n, 0, 0, fc);


  if (nn > 2) {
    // Edge is not flipped. Unmarktest the remaining tets in Star(ab).
    for (i = 0; i < nn; i++) {
      setelemcounter(abtets[i], 0);
    }
    // Restore the input edge (needed by Lawson's flip).
    *flipedge = abtets[0];
  }

  // Release the temporary allocated spaces.
  // NOTE: fc->unflip must be 0.
  int bakunflip = fc->unflip;
  fc->unflip = 0;
  flipnm_post(abtets, n, nn, 0, fc);
  fc->unflip = bakunflip;

  delete [] abtets;

  return nn; 
}